

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_free_value(lyd_val value,LY_DATA_TYPE value_type,uint8_t value_flags,lys_type *type,
                   char *value_str,lyd_val *old_val,LY_DATA_TYPE *old_val_type,
                   uint8_t *old_val_flags)

{
  lyd_val *old_val_local;
  char *value_str_local;
  lys_type *type_local;
  uint8_t value_flags_local;
  LY_DATA_TYPE value_type_local;
  lyd_val value_local;
  
  if (old_val == (lyd_val *)0x0) {
    if ((value_flags & 2) == 0) {
      if (value_type == LY_TYPE_BITS) {
        if (value.binary != (char *)0x0) {
          free(value.ptr);
        }
      }
      else {
        if (value_type == LY_TYPE_INST) {
          if ((value_flags & 1) == 0) {
            return;
          }
        }
        else if (value_type != LY_TYPE_UNION) {
          return;
        }
        lydict_remove(type->parent->module->ctx,value.binary);
      }
    }
    else {
      lytype_free(type,value,value_str);
    }
  }
  else {
    *old_val = value;
    *old_val_type = value_type;
    *old_val_flags = value_flags;
  }
  return;
}

Assistant:

void
lyd_free_value(lyd_val value, LY_DATA_TYPE value_type, uint8_t value_flags, struct lys_type *type, const char *value_str,
               lyd_val *old_val, LY_DATA_TYPE *old_val_type, uint8_t *old_val_flags)
{
    if (old_val) {
        *old_val = value;
        *old_val_type = value_type;
        *old_val_flags = value_flags;
        /* we only backup the values for now */
        return;
    }

    /* otherwise the value is correctly freed */
    if (value_flags & LY_VALUE_USER) {
        lytype_free(type, value, value_str);
    } else {
        switch (value_type) {
        case LY_TYPE_BITS:
            if (value.bit) {
                free(value.bit);
            }
            break;
        case LY_TYPE_INST:
            if (!(value_flags & LY_VALUE_UNRES)) {
                break;
            }
            /* fallthrough */
        case LY_TYPE_UNION:
            /* unresolved union leaf */
            lydict_remove(type->parent->module->ctx, value.string);
            break;
        default:
            break;
        }
    }
}